

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

FT_UShort * ft_var_readpackedpoints(FT_Stream stream,FT_ULong size,FT_UInt *point_cnt)

{
  byte bVar1;
  FT_UInt16 FVar2;
  uint uVar3;
  int local_54;
  FT_Memory pFStack_50;
  FT_Error error;
  FT_Memory memory;
  uint local_40;
  uint uStack_3c;
  FT_UShort first;
  FT_UInt j;
  FT_UInt i;
  FT_UInt runcnt;
  FT_UInt n;
  FT_UShort *points;
  FT_UInt *point_cnt_local;
  FT_ULong size_local;
  FT_Stream stream_local;
  
  _runcnt = (FT_Stream)0x0;
  pFStack_50 = stream->memory;
  *point_cnt = 0;
  points = (FT_UShort *)point_cnt;
  point_cnt_local = (FT_UInt *)size;
  size_local = (FT_ULong)stream;
  bVar1 = FT_Stream_GetByte(stream);
  i = (FT_UInt)bVar1;
  if (i == 0) {
    stream_local = (FT_Stream)0xffffffffffffffff;
  }
  else {
    if ((bVar1 & 0x80) != 0) {
      i = (i & 0x7f) << 8;
      bVar1 = FT_Stream_GetByte((FT_Stream)size_local);
      i = bVar1 | i;
    }
    if (point_cnt_local < (FT_UInt *)(ulong)i) {
      stream_local = (FT_Stream)0x0;
    }
    else {
      _runcnt = (FT_Stream)ft_mem_qrealloc(pFStack_50,2,0,(ulong)(i + 1),(void *)0x0,&local_54);
      if (local_54 == 0) {
        *(FT_UInt *)points = i;
        memory._6_2_ = 0;
        uStack_3c = 0;
LAB_0034cc63:
        if (uStack_3c < i) {
          bVar1 = FT_Stream_GetByte((FT_Stream)size_local);
          j = (FT_UInt)bVar1;
          if ((bVar1 & 0x80) == 0) {
            bVar1 = FT_Stream_GetByte((FT_Stream)size_local);
            memory._6_2_ = memory._6_2_ + (ushort)bVar1;
            *(short *)((long)&_runcnt->base + (ulong)uStack_3c * 2) = memory._6_2_;
            uStack_3c = uStack_3c + 1;
            for (local_40 = 0; local_40 < j; local_40 = local_40 + 1) {
              bVar1 = FT_Stream_GetByte((FT_Stream)size_local);
              memory._6_2_ = memory._6_2_ + (ushort)bVar1;
              uVar3 = uStack_3c + 1;
              *(short *)((long)&_runcnt->base + (ulong)uStack_3c * 2) = memory._6_2_;
              uStack_3c = uVar3;
              if (i <= uVar3) break;
            }
          }
          else {
            j = j & 0x7f;
            FVar2 = FT_Stream_GetUShort((FT_Stream)size_local);
            memory._6_2_ = memory._6_2_ + FVar2;
            *(short *)((long)&_runcnt->base + (ulong)uStack_3c * 2) = memory._6_2_;
            uStack_3c = uStack_3c + 1;
            for (local_40 = 0; local_40 < j; local_40 = local_40 + 1) {
              FVar2 = FT_Stream_GetUShort((FT_Stream)size_local);
              memory._6_2_ = memory._6_2_ + FVar2;
              uVar3 = uStack_3c + 1;
              *(short *)((long)&_runcnt->base + (ulong)uStack_3c * 2) = memory._6_2_;
              uStack_3c = uVar3;
              if (i <= uVar3) break;
            }
          }
          goto LAB_0034cc63;
        }
        stream_local = _runcnt;
      }
      else {
        stream_local = (FT_Stream)0x0;
      }
    }
  }
  return (FT_UShort *)stream_local;
}

Assistant:

static FT_UShort*
  ft_var_readpackedpoints( FT_Stream  stream,
                           FT_ULong   size,
                           FT_UInt   *point_cnt )
  {
    FT_UShort *points = NULL;
    FT_UInt    n;
    FT_UInt    runcnt;
    FT_UInt    i, j;
    FT_UShort  first;
    FT_Memory  memory = stream->memory;
    FT_Error   error;


    *point_cnt = 0;

    n = FT_GET_BYTE();
    if ( n == 0 )
      return ALL_POINTS;

    if ( n & GX_PT_POINTS_ARE_WORDS )
    {
      n  &= GX_PT_POINT_RUN_COUNT_MASK;
      n <<= 8;
      n  |= FT_GET_BYTE();
    }

    if ( n > size )
    {
      FT_TRACE1(( "ft_var_readpackedpoints: number of points too large\n" ));
      return NULL;
    }

    /* in the nested loops below we increase `i' twice; */
    /* it is faster to simply allocate one more slot    */
    /* than to add another test within the loop         */
    if ( FT_QNEW_ARRAY( points, n + 1 ) )
      return NULL;

    *point_cnt = n;

    first = 0;
    i     = 0;
    while ( i < n )
    {
      runcnt = FT_GET_BYTE();
      if ( runcnt & GX_PT_POINTS_ARE_WORDS )
      {
        runcnt     &= GX_PT_POINT_RUN_COUNT_MASK;
        first      += FT_GET_USHORT();
        points[i++] = first;

        /* first point not included in run count */
        for ( j = 0; j < runcnt; j++ )
        {
          first      += FT_GET_USHORT();
          points[i++] = first;
          if ( i >= n )
            break;
        }
      }
      else
      {
        first      += FT_GET_BYTE();
        points[i++] = first;

        for ( j = 0; j < runcnt; j++ )
        {
          first      += FT_GET_BYTE();
          points[i++] = first;
          if ( i >= n )
            break;
        }
      }
    }

    return points;
  }